

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 14.hpp
# Opt level: O2

void __thiscall njoy::ENDFtk::section::Type<14>::Type(Type<14> *this,Type<14> *param_1)

{
  double dVar1;
  undefined4 uVar2;
  
  uVar2 = *(undefined4 *)&(param_1->super_Base).field_0x14;
  (this->super_Base).MT_ = (param_1->super_Base).MT_;
  *(undefined4 *)&(this->super_Base).field_0x14 = uVar2;
  uVar2 = *(undefined4 *)
           &(param_1->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.field_0x4;
  dVar1 = (param_1->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.atomicWeightRatio_;
  (this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_ =
       (param_1->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_;
  *(undefined4 *)&(this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.field_0x4 =
       uVar2;
  (this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.atomicWeightRatio_ = dVar1;
  *(undefined4 *)&(this->super_Base).field_0x14 = *(undefined4 *)&(param_1->super_Base).field_0x14;
  std::
  vector<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<14>::IsotropicDiscretePhoton,_njoy::ENDFtk::section::Type<14>::LegendreDistributions,_njoy::ENDFtk::section::Type<14>::TabulatedDistributions>_>_>
  ::vector(&this->photons_,&param_1->photons_);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT Type< 14 > : protected Base {

  protected:

    #include "ENDFtk/section/4/AngularDistributions.hpp" // MF4 component taken over as is

  public:

    #include "ENDFtk/section/14/IsotropicDiscretePhoton.hpp"
    #include "ENDFtk/section/4/LegendreCoefficients.hpp"  // MF4 component taken over as is
    #include "ENDFtk/section/4/TabulatedDistribution.hpp" // MF4 component taken over as is
    #include "ENDFtk/section/14/LegendreDistributions.hpp"
    #include "ENDFtk/section/14/TabulatedDistributions.hpp"

    /** @typedef PhotonDistribution
     *  @brief The angular distribution of a given discrete photon
     *
     *  This distribution class is set up as a variant.
     */
    using PhotonDistribution = std::variant< IsotropicDiscretePhoton,
                                             LegendreDistributions,
                                             TabulatedDistributions >;

    /** @typedef PhotonDistribution
     *  @brief The angular distribution of a given discrete photon
     *
     *  This distribution class is set up as a variant.
     */
    using AnisotropicPhotonDistribution = std::variant< LegendreDistributions,
                                                        TabulatedDistributions >;

  private:

    /* type aliases */

    /* fields */
    unsigned int nk_;
    std::vector< PhotonDistribution > photons_;

    /* auxiliary functions */
    #include "ENDFtk/section/14/src/readPhotons.hpp"
    #include "ENDFtk/section/14/src/makePhotonDistributions.hpp"
    #include "ENDFtk/section/14/src/makeArrays.hpp"

  public:

    /* constructor */
    #include "ENDFtk/section/14/src/ctor.hpp"

    /* get methods */

    /**
     *  @brief Return the number of photons with an isotropic angular
     *         distribution
     */
    int NI() const {

      return ranges::count_if( this->photons_,
                               [] ( const auto& entry )
                                  { return entry.index() == 0; } );
    }

    /**
     *  @brief Return the number of photons with an isotropic angular
     *         distribution
     */
    int numberIsotropicPhotons() const { return this->NI(); }

    /**
     *  @brief Return the number of photons (discrete and continuum) with
     *         angular distributionss
     */
    int NK() const {

      return this->photons_.size() ? this->photons_.size() : this->nk_;
    }

    /**
     *  @brief Return the number of photons (discrete and continuum) with
     *         angular distributions
     */
    int numberPhotons() const { return this->NK(); }

    /**
     *  @brief Return the isotropic angular distribution flag
     */
    bool LI() const { return this->photons_.size() == 0; }

    /**
     *  @brief Return the isotropic angular distribution flag
     */
    bool isotropicDistributions() const { return this->LI(); }

    /**
     *  @brief Return the distribution law
     */
    int LTT() const {

      return this->LI() ? 0
                        : std::visit( [] ( const auto& photon )
                                         { return photon.LTT(); },
                                      this->photons_.back() );
    }

    /**
     *  @brief Return the distribution law
     */
    int LAW() const { return this->LTT(); }

    /**
     *  @brief Return the secondary photons with their angular distribution
     */
    const auto& photonAngularDistributions() const { return this->photons_; }

    #include "ENDFtk/section/14/src/NC.hpp"
    #include "ENDFtk/section/14/src/print.hpp"

    using Base::MT;
    using Base::sectionNumber;
    using Base::ZA;
    using Base::targetIdentifier;
    using Base::atomicWeightRatio;
    using Base::AWR;
  }